

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpChunkedEntityReader::tryReadInternal
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes,
          size_t alreadyRead)

{
  ulong maxBytes_00;
  long lVar1;
  undefined8 uVar2;
  TransformPromiseNodeBase *pTVar3;
  HttpInputStreamImpl *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  Own<kj::_::PromiseNode> *this_01;
  ArrayDisposer *in_R9;
  Promise<unsigned_long> PVar5;
  Own<kj::_::PromiseNode> intermediate;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  ArrayDisposer *local_38;
  
  if (*(char *)((long)buffer + 0x10) == '\x01') {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)in_R9);
    pPVar4 = extraout_RDX;
    goto LAB_002a822e;
  }
  maxBytes_00 = *(ulong *)((long)buffer + 0x18);
  local_58._16_8_ = in_R9;
  if (maxBytes_00 == 0) {
    lVar1 = *(long *)((long)buffer + 8);
    if (*(long *)(lVar1 + 0xc0) == 0) {
      _::Debug::Fault::Fault
                ((Fault *)&intermediate,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x466,FAILED,"onMessageDone != nullptr","");
      _::Debug::Fault::fatal((Fault *)&intermediate);
    }
    HttpInputStreamImpl::readHeader
              ((HttpInputStreamImpl *)local_68,(HeaderType)lVar1,1,*(size_t *)(lVar1 + 0x28));
    pTVar3 = (TransformPromiseNodeBase *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar3,(Own<kj::_::PromiseNode> *)local_68,
               _::
               TransformPromiseNode<unsigned_long,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1130:15),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00427eb0;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readChunkHeader()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
          ::instance;
    local_58._24_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readChunkHeader()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)0x0;
    local_58._0_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readChunkHeader()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
          ::instance;
    local_38 = (ArrayDisposer *)0x0;
    local_58._8_8_ = pTVar3;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_58 + 0x18));
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_68);
    pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar3,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1533:43),_kj::_::PropagateException>
               ::anon_class_40_5_00d635ec_for_func::operator());
    (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00427f38;
    pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
    pTVar3[1].dependency.disposer = (Disposer *)minBytes;
    pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
    pTVar3[1].continuationTracePtr = (void *)alreadyRead;
    pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_58._16_8_;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)pTVar3;
    _::maybeChain<unsigned_long>
              ((Own<kj::_::PromiseNode> *)local_68,(Promise<unsigned_long> *)&intermediate);
    uVar2 = local_68._8_8_;
    local_58._24_8_ = local_68._0_8_;
    local_68._8_8_ = (HttpInputStreamImpl *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_68);
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_68._0_8_;
    (this->super_HttpEntityBodyReader).inner = (HttpInputStreamImpl *)uVar2;
    local_38 = (ArrayDisposer *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_58 + 0x18));
    Own<kj::_::PromiseNode>::dispose(&intermediate);
LAB_002a8197:
    this_01 = (Own<kj::_::PromiseNode> *)local_58;
  }
  else {
    if (maxBytes_00 < maxBytes) {
      HttpInputStreamImpl::tryRead
                ((HttpInputStreamImpl *)local_58,*(void **)((long)buffer + 8),minBytes,maxBytes_00);
      pTVar3 = (TransformPromiseNodeBase *)operator_new(0x50);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar3,(Own<kj::_::PromiseNode> *)local_58,
                 _::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1544:17),_kj::_::PropagateException>
                 ::anon_class_40_5_00d635ec_for_func::operator());
      (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428048;
      pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
      pTVar3[1].dependency.disposer = (Disposer *)minBytes;
      pTVar3[1].dependency.ptr = (PromiseNode *)maxBytes;
      pTVar3[1].continuationTracePtr = (void *)alreadyRead;
      pTVar3[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_58._16_8_;
      intermediate.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#2},kj::_::PropagateException>>
            ::instance;
      intermediate.ptr = (PromiseNode *)pTVar3;
      _::maybeChain<unsigned_long>
                ((Own<kj::_::PromiseNode> *)local_68,(Promise<unsigned_long> *)&intermediate);
      uVar2 = local_68._8_8_;
      local_58._24_8_ = local_68._0_8_;
      local_68._8_8_ = (HttpInputStreamImpl *)0x0;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_68);
      (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)local_68._0_8_;
      (this->super_HttpEntityBodyReader).inner = (HttpInputStreamImpl *)uVar2;
      local_38 = (ArrayDisposer *)0x0;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_58 + 0x18));
      Own<kj::_::PromiseNode>::dispose(&intermediate);
      goto LAB_002a8197;
    }
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_68,*(void **)((long)buffer + 8),minBytes,maxBytes);
    this_00 = (HttpInputStreamImpl *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_68,
               _::
               TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1556:17),_kj::_::PropagateException>
               ::anon_class_16_2_66fb283b_for_func::operator());
    (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_004280d0;
    (this_00->headerBuffer).disposer = (ArrayDisposer *)buffer;
    this_00->messageHeaderEnd = local_58._16_8_;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
          ::instance;
    local_58._24_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)0x0;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpChunkedEntityReader::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda(unsigned_long)#3},kj::_::PropagateException>>
          ::instance;
    (this->super_HttpEntityBodyReader).inner = this_00;
    local_38 = (ArrayDisposer *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_58 + 0x18));
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    this_01 = (Own<kj::_::PromiseNode> *)local_68;
  }
  Own<kj::_::PromiseNode>::dispose(this_01);
  pPVar4 = extraout_RDX_00;
LAB_002a822e:
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    if (alreadyDone()) {
      return alreadyRead;
    } else if (chunkSize == 0) {
      // Read next chunk header.
      return inner.readChunkHeader().then([=](uint64_t nextChunkSize) {
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (chunkSize < minBytes) {
      // Read entire current chunk and continue to next chunk.
      return inner.tryRead(buffer, chunkSize, chunkSize)
          .then([=](size_t amount) -> kj::Promise<size_t> {
        chunkSize -= amount;
        if (chunkSize > 0) {
          return KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk");
        }

        return tryReadInternal(reinterpret_cast<byte*>(buffer) + amount,
                               minBytes - amount, maxBytes - amount, alreadyRead + amount);
      });
    } else {
      // Read only part of the current chunk.
      return inner.tryRead(buffer, minBytes, kj::min(maxBytes, chunkSize))
          .then([=](size_t amount) -> size_t {
        chunkSize -= amount;
        return alreadyRead + amount;
      });
    }
  }